

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall QArrayDataPointer<char>::clear(QArrayDataPointer<char> *this)

{
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char> tmp;
  QArrayDataPointer<char> *in_stack_ffffffffffffffb8;
  QArrayDataPointer<char> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = -0x5555555555555556;
  local_28.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer(&local_28);
  swap(in_RDI,in_stack_ffffffffffffffb8);
  ~QArrayDataPointer(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() noexcept(std::is_nothrow_destructible<T>::value)
    {
        QArrayDataPointer tmp;
        swap(tmp);
    }